

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config(ConfigBase *this,istream *input)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<char> __l_02;
  string *psVar1;
  bool bVar2;
  __type_conflict _Var3;
  byte bVar4;
  undefined1 uVar5;
  int iVar6;
  istream *piVar7;
  reference pvVar8;
  size_type sVar9;
  string *psVar10;
  reference pvVar11;
  size_type sVar12;
  istream *in_RDX;
  long in_RSI;
  string *in_RDI;
  string ename;
  invalid_argument *ia;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  string multiline;
  invalid_argument *iarg_1;
  string l2;
  invalid_argument *iarg;
  bool firstLine;
  bool lineExtension;
  value_type keyChar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  citems;
  bool mlquote;
  string item;
  size_type comment_pos;
  size_type delimiter_pos;
  value_type test_char;
  size_t search_start;
  value_type cchar;
  size_t len;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  string line_sep_chars;
  int currentSectionIndex;
  char aSep;
  char aEnd;
  char aStart;
  bool inMLineValue;
  bool inMLineComment;
  bool inSection;
  bool isINIArray;
  bool isDefaultArray;
  string previousSection;
  string currentSection;
  string buffer;
  string line;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c8;
  char *__s;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  value_type *in_stack_fffffffffffff6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e0;
  iterator in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f7;
  iterator in_stack_fffffffffffff6f8;
  iterator in_stack_fffffffffffff700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff708;
  undefined6 in_stack_fffffffffffff710;
  char in_stack_fffffffffffff716;
  char in_stack_fffffffffffff717;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff718;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff720;
  const_iterator in_stack_fffffffffffff728;
  undefined1 ***local_8a0;
  allocator<char> *in_stack_fffffffffffff778;
  size_t in_stack_fffffffffffff780;
  string *in_stack_fffffffffffff788;
  undefined1 ***local_848;
  bool local_821;
  char in_stack_fffffffffffff7f7;
  string *in_stack_fffffffffffff7f8;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_fffffffffffff800;
  string *in_stack_fffffffffffff810;
  string *in_stack_fffffffffffff818;
  bool local_775;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff898;
  char parentSeparator;
  string *in_stack_fffffffffffff8a0;
  string *in_stack_fffffffffffff8a8;
  undefined1 local_6fd;
  char local_6fc;
  char local_6fb;
  bool local_6fa;
  bool local_6f9;
  char local_6d0 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_668;
  reference local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_620;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_618;
  undefined1 *local_610;
  undefined1 local_608 [54];
  undefined1 local_5d2;
  allocator<char> local_5d1;
  undefined8 **local_5d0;
  undefined1 **local_5c8 [4];
  undefined8 **local_5a8;
  undefined8 local_5a0;
  undefined8 **local_558;
  undefined1 **local_550 [4];
  undefined8 **local_530;
  undefined8 local_528;
  string local_440 [32];
  string *local_420;
  string local_418;
  string local_3f8 [3];
  string local_398 [118];
  byte local_322;
  byte local_321;
  value_type local_2f9;
  bool local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [3];
  size_type local_218;
  ulong local_210;
  char local_201;
  string *local_200;
  value_type local_15d;
  int local_15c;
  size_type local_158;
  undefined1 local_110 [29];
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [2];
  int local_c0;
  undefined1 local_ba;
  char local_b9;
  char local_b8;
  byte local_b7;
  byte local_b6;
  byte local_b5;
  bool local_b4;
  bool local_b3;
  byte local_b2;
  allocator<char> local_b1 [56];
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  istream *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::string::string(in_stack_fffffffffffff6e0);
  ::std::__cxx11::string::string(in_stack_fffffffffffff6e0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff717,
                      CONCAT16(in_stack_fffffffffffff716,in_stack_fffffffffffff710)),
             (char *)in_stack_fffffffffffff708,
             (allocator<char> *)in_stack_fffffffffffff700._M_current);
  ::std::allocator<char>::~allocator(&local_79);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff717,
                      CONCAT16(in_stack_fffffffffffff716,in_stack_fffffffffffff710)),
             (char *)in_stack_fffffffffffff708,
             (allocator<char> *)in_stack_fffffffffffff700._M_current);
  ::std::allocator<char>::~allocator(local_b1);
  local_b2 = 0;
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::vector
            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)0x18a501);
  local_6f9 = false;
  if ((*(char *)(in_RSI + 0x21) == '[') && (local_6f9 = false, *(char *)(in_RSI + 0x22) == ']')) {
    local_6f9 = *(char *)(in_RSI + 0x23) == ',';
  }
  local_b3 = local_6f9;
  if ((*(char *)(in_RSI + 0x21) == '\0') || (local_6fa = false, *(char *)(in_RSI + 0x21) == ' ')) {
    local_6fa = *(char *)(in_RSI + 0x21) == *(char *)(in_RSI + 0x22);
  }
  local_b4 = local_6fa;
  local_b5 = 0;
  local_b6 = 0;
  local_b7 = 0;
  if (local_6fa == false) {
    local_6fb = *(char *)(in_RSI + 0x21);
  }
  else {
    local_6fb = '[';
  }
  local_b8 = local_6fb;
  if (local_6fa == false) {
    local_6fc = *(char *)(in_RSI + 0x22);
  }
  else {
    local_6fc = ']';
  }
  local_b9 = local_6fc;
  if ((local_6fa == false) || (*(char *)(in_RSI + 0x23) != ' ')) {
    local_6fd = *(undefined1 *)(in_RSI + 0x23);
  }
  else {
    local_6fd = 0x2c;
  }
  local_ba = local_6fd;
  local_c0 = 0;
  local_f3 = *(undefined1 *)(in_RSI + 0x28);
  local_f2 = *(undefined1 *)(in_RSI + 0x20);
  local_f1 = *(undefined1 *)(in_RSI + 0x24);
  local_f0 = &local_f3;
  local_e8[0]._M_allocated_capacity = 3;
  ::std::allocator<char>::allocator();
  __l_02._M_len = (size_type)in_stack_fffffffffffff700._M_current;
  __l_02._M_array = in_stack_fffffffffffff6f8;
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l_02,
             (allocator<char> *)in_stack_fffffffffffff6e8._M_current);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_110 + 0x1c));
  do {
    piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>(local_18,local_58);
    bVar2 = ::std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    parentSeparator = (char)((ulong)in_stack_fffffffffffff898 >> 0x38);
    if (!bVar2) {
      uVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                                (char *)in_stack_fffffffffffff6c8);
      if (((uVar5 ^ 0xff) & 1) != 0) {
        ::std::__cxx11::string::string(in_stack_fffffffffffff6e0);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                   CONCAT17(uVar5,in_stack_fffffffffffff6d0));
        CLI::detail::generate_parents
                  (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,parentSeparator);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                   CONCAT17(uVar5,in_stack_fffffffffffff6d0));
        __s = local_6d0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6e0);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                   CONCAT17(uVar5,in_stack_fffffffffffff6d0));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar5,in_stack_fffffffffffff6d0),__s);
        while( true ) {
          pvVar11 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                               CONCAT17(uVar5,in_stack_fffffffffffff6d0));
          sVar12 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&pvVar11->parents);
          if (sVar12 < 2) break;
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                    ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffff6d0));
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                     in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                    ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffff6d0));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x18ca2f);
        }
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar5,in_stack_fffffffffffff6d0));
      }
      local_b2 = 1;
      local_15c = 1;
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar5,in_stack_fffffffffffff6d0));
      if ((local_b2 & 1) == 0) {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                   in_stack_fffffffffffff6e0);
      }
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar5,in_stack_fffffffffffff6d0));
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar5,in_stack_fffffffffffff6d0));
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar5,in_stack_fffffffffffff6d0));
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar5,in_stack_fffffffffffff6d0));
      return (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)in_RDI;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x18a770);
    ::std::__cxx11::string::string(in_stack_fffffffffffff6e0);
    CLI::detail::trim_copy(in_stack_fffffffffffff718._M_current);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffff720._M_current,in_stack_fffffffffffff718._M_current);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
    local_158 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(&local_38);
    if (local_158 < 3) {
      local_15c = 2;
    }
    else {
      iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_fffffffffffff700._M_current,(size_type)in_stack_fffffffffffff6f8,
                      CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                      (char *)in_stack_fffffffffffff6e8._M_current);
      if ((iVar6 == 0) ||
         (iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(in_stack_fffffffffffff700._M_current,(size_type)in_stack_fffffffffffff6f8,
                          CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                          (char *)in_stack_fffffffffffff6e8._M_current), iVar6 == 0)) {
        local_b6 = 1;
        pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
        local_15d = *pvVar8;
        while ((local_b6 & 1) != 0) {
          piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (local_18,(string *)&local_38);
          bVar2 = ::std::ios::operator_cast_to_bool
                            ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
          if (!bVar2) break;
          CLI::detail::trim((string *)0x18a97b);
          bVar2 = CLI::detail::hasMLString
                            (in_stack_fffffffffffff6e8._M_current,
                             (char)((ulong)in_stack_fffffffffffff6e0 >> 0x38));
          if (bVar2) {
            local_b6 = 0;
          }
        }
        local_15c = 2;
      }
      else {
        pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
        if ((*pvVar8 == '[') &&
           (pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)),
           *pvVar8 == ']')) {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)
                                    ,(char *)in_stack_fffffffffffff6c8);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                       CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            CLI::detail::generate_parents
                      (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                       (char)((ulong)in_stack_fffffffffffff898 >> 0x38));
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                       CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6e0);
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                       CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                      (char *)in_stack_fffffffffffff6c8);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_stack_fffffffffffff6e8._M_current,(size_type)in_stack_fffffffffffff6e0,
                     (size_type)in_stack_fffffffffffff6d8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff720._M_current,in_stack_fffffffffffff718._M_current);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
          sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&local_78);
          if (((1 < sVar9) &&
              (pvVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0))
              , *pvVar8 == '[')) &&
             (pvVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)),
             *pvVar8 == ']')) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_78);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (in_stack_fffffffffffff6e8._M_current,(size_type)in_stack_fffffffffffff6e0,
                       (size_type)in_stack_fffffffffffff6d8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff720._M_current,in_stack_fffffffffffff718._M_current);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
          }
          ::std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff717,
                              CONCAT16(in_stack_fffffffffffff716,in_stack_fffffffffffff710)),
                     in_stack_fffffffffffff708);
          CLI::detail::to_lower(in_stack_fffffffffffff708);
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)
                                    ,(char *)in_stack_fffffffffffff6c8);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
          if (bVar2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                      (char *)in_stack_fffffffffffff6c8);
          }
          else {
            CLI::detail::checkParentSegments
                      (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f7
                      );
          }
          local_b5 = 0;
          _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0)
                                    ,in_stack_fffffffffffff6e8._M_current);
          if (_Var3) {
            local_c0 = local_c0 + 1;
          }
          else {
            local_c0 = 0;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                      in_stack_fffffffffffff6c8);
          }
          local_15c = 2;
        }
        else {
          pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
          if (((*pvVar8 == ';') ||
              (pvVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0))
              , *pvVar8 == '#')) ||
             (pvVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)),
             *pvVar8 == *(char *)(in_RSI + 0x20))) {
            local_15c = 2;
          }
          else {
            local_200 = (string *)0x0;
            sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0)
                                    ,(char *)in_stack_fffffffffffff6e8._M_current,
                                    (size_type)in_stack_fffffffffffff6e0);
            if (sVar9 != 0xffffffffffffffff) {
              while (psVar1 = local_200,
                    psVar10 = (string *)
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              size(&local_38), psVar1 < psVar10) {
                pvVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)
                                    ,(size_type)in_stack_fffffffffffff6c8);
                local_201 = *pvVar8;
                if (((local_201 == '\"') || (local_201 == '\'')) || (local_201 == '`')) {
                  in_stack_fffffffffffff898 = &local_38;
                  in_stack_fffffffffffff8a0 = local_200;
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                             (size_type)in_stack_fffffffffffff6c8);
                  in_stack_fffffffffffff8a8 =
                       (string *)
                       CLI::detail::close_sequence
                                 (in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                                  (char)((ulong)in_stack_fffffffffffff778 >> 0x38));
                  local_200 = (string *)((long)&(in_stack_fffffffffffff8a8->_M_dataplus)._M_p + 1);
                }
                else {
                  if ((local_201 == *(char *)(in_RSI + 0x24)) ||
                     (local_201 == *(char *)(in_RSI + 0x20))) {
                    local_200 = (string *)((long)&local_200[-1].field_2 + 0xf);
                    break;
                  }
                  if (((local_201 == ' ') || (local_201 == '\t')) ||
                     (local_201 == *(char *)(in_RSI + 0x28))) {
                    local_200 = (string *)((long)&(local_200->_M_dataplus)._M_p + 1);
                  }
                  else {
                    local_200 = (string *)
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffff6f7,
                                                          in_stack_fffffffffffff6f0),
                                              in_stack_fffffffffffff6e8._M_current,
                                              (size_type)in_stack_fffffffffffff6e0);
                  }
                }
              }
            }
            local_210 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffff6d7,
                                                  in_stack_fffffffffffff6d0),
                                      (char)((ulong)in_stack_fffffffffffff6c8 >> 0x38),0x18af56);
            local_218 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffff6d7,
                                                  in_stack_fffffffffffff6d0),
                                      (char)((ulong)in_stack_fffffffffffff6c8 >> 0x38),0x18af84);
            if (local_218 < local_210) {
              local_210 = 0xffffffffffffffff;
            }
            if (local_210 == 0xffffffffffffffff) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(in_stack_fffffffffffff6e8._M_current,(size_type)in_stack_fffffffffffff6e0,
                     (size_type)in_stack_fffffffffffff6d8);
              CLI::detail::trim_copy(in_stack_fffffffffffff718._M_current);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_fffffffffffff720._M_current,in_stack_fffffffffffff718._M_current);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              local_5d2 = 1;
              local_5d0 = local_5c8;
              in_stack_fffffffffffff778 = &local_5d1;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff717,
                                  CONCAT16(in_stack_fffffffffffff716,in_stack_fffffffffffff710)),
                         (char *)in_stack_fffffffffffff708,
                         (allocator<char> *)in_stack_fffffffffffff700._M_current);
              local_5d2 = 0;
              local_5a8 = local_5c8;
              local_5a0 = 1;
              __l_01._M_len._0_7_ = in_stack_fffffffffffff6f0;
              __l_01._M_array = in_stack_fffffffffffff6e8._M_current;
              __l_01._M_len._7_1_ = in_stack_fffffffffffff6f7;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff6e0,__l_01);
              local_8a0 = (undefined1 ***)&local_5a8;
              do {
                local_8a0 = local_8a0 + -4;
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              } while (local_8a0 != local_5c8);
              ::std::allocator<char>::~allocator(&local_5d1);
            }
            else {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(in_stack_fffffffffffff6e8._M_current,(size_type)in_stack_fffffffffffff6e0,
                     (size_type)in_stack_fffffffffffff6d8);
              CLI::detail::trim_copy(in_stack_fffffffffffff718._M_current);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_fffffffffffff720._M_current,in_stack_fffffffffffff718._M_current);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(in_stack_fffffffffffff6e8._M_current,(size_type)in_stack_fffffffffffff6e0,
                     (size_type)in_stack_fffffffffffff6d8);
              CLI::detail::trim_copy(in_stack_fffffffffffff718._M_current);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              iVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (in_stack_fffffffffffff700._M_current,
                                 (size_type)in_stack_fffffffffffff6f8,
                                 CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                                 (char *)in_stack_fffffffffffff6e8._M_current);
              local_775 = true;
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (in_stack_fffffffffffff700._M_current,
                                   (size_type)in_stack_fffffffffffff6f8,
                                   CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                                   (char *)in_stack_fffffffffffff6e8._M_current);
                local_775 = iVar6 == 0;
              }
              local_299 = local_775;
              if ((local_775 == false) && (local_218 != 0xffffffffffffffff)) {
                ::std::__cxx11::string::string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff717,
                                    CONCAT16(in_stack_fffffffffffff716,in_stack_fffffffffffff710)),
                           in_stack_fffffffffffff708);
                CLI::detail::split_up
                          (in_stack_fffffffffffff818,
                           (char)((ulong)in_stack_fffffffffffff810 >> 0x38));
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                CLI::detail::trim_copy(in_stack_fffffffffffff718._M_current);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(in_stack_fffffffffffff720._M_current,in_stack_fffffffffffff718._M_current)
                ;
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff6e0);
              }
              if ((local_299 & 1U) == 0) {
                sVar9 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (local_278);
                if ((sVar9 < 2) ||
                   (pvVar8 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0))
                   , *pvVar8 != local_b8)) {
                  if ((((local_b3 & 1U) == 0) && ((local_b4 & 1U) == 0)) ||
                     (sVar9 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffff6d7,
                                                        in_stack_fffffffffffff6d0),
                                            (char)((ulong)in_stack_fffffffffffff6c8 >> 0x38),
                                            0x18be0d), sVar9 == 0xffffffffffffffff)) {
                    if ((((local_b3 & 1U) == 0) && ((local_b4 & 1U) == 0)) ||
                       (sVar9 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffff6d7,
                                                          in_stack_fffffffffffff6d0),
                                              (char)((ulong)in_stack_fffffffffffff6c8 >> 0x38),
                                              0x18bed5), sVar9 == 0xffffffffffffffff)) {
                      local_558 = local_550;
                      ::std::__cxx11::string::string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff717,
                                             CONCAT16(in_stack_fffffffffffff716,
                                                      in_stack_fffffffffffff710)),
                                 in_stack_fffffffffffff708);
                      local_530 = local_550;
                      local_528 = 1;
                      __l_00._M_len._0_7_ = in_stack_fffffffffffff6f0;
                      __l_00._M_array = in_stack_fffffffffffff6e8._M_current;
                      __l_00._M_len._7_1_ = in_stack_fffffffffffff6f7;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff6e0,__l_00);
                      local_848 = (undefined1 ***)&local_530;
                      do {
                        local_848 = local_848 + -4;
                        ::std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0))
                        ;
                      } while (local_848 != local_550);
                    }
                    else {
                      ::std::__cxx11::string::string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff717,
                                             CONCAT16(in_stack_fffffffffffff716,
                                                      in_stack_fffffffffffff710)),
                                 in_stack_fffffffffffff708);
                      CLI::detail::split_up
                                (in_stack_fffffffffffff818,
                                 (char)((ulong)in_stack_fffffffffffff810 >> 0x38));
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6e0);
                      ::std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                    }
                  }
                  else {
                    ::std::__cxx11::string::string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff717,
                                        CONCAT16(in_stack_fffffffffffff716,in_stack_fffffffffffff710
                                                )),in_stack_fffffffffffff708);
                    CLI::detail::split_up
                              (in_stack_fffffffffffff818,
                               (char)((ulong)in_stack_fffffffffffff810 >> 0x38));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6e0);
                    ::std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  }
                }
                else {
                  ::std::__cxx11::string::string(in_stack_fffffffffffff6e0);
                  while( true ) {
                    pvVar8 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffff6d7,
                                                    in_stack_fffffffffffff6d0));
                    local_821 = false;
                    if (*pvVar8 != local_b9) {
                      piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         (local_18,local_440);
                      local_821 = ::std::ios::operator_cast_to_bool
                                            ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                    }
                    if (local_821 == false) break;
                    CLI::detail::trim((string *)0x18bc4f);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                                 in_stack_fffffffffffff6c8);
                  }
                  local_15c = 10;
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  pvVar8 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffff6d7,
                                                  in_stack_fffffffffffff6d0));
                  if (*pvVar8 == local_b9) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::length(local_278);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(in_stack_fffffffffffff6e8._M_current,
                             (size_type)in_stack_fffffffffffff6e0,
                             (size_type)in_stack_fffffffffffff6d8);
                    CLI::detail::split_up
                              (in_stack_fffffffffffff818,
                               (char)((ulong)in_stack_fffffffffffff810 >> 0x38));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6e0);
                    ::std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  }
                  else {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(in_stack_fffffffffffff6e8._M_current,
                             (size_type)in_stack_fffffffffffff6e0,
                             (size_type)in_stack_fffffffffffff6d8);
                    CLI::detail::split_up
                              (in_stack_fffffffffffff818,
                               (char)((ulong)in_stack_fffffffffffff810 >> 0x38));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6e0);
                    ::std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  }
                }
              }
              else {
                pvVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)
                                   );
                local_2f9 = *pvVar8;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(in_stack_fffffffffffff6e8._M_current,(size_type)in_stack_fffffffffffff6e0,
                       (size_type)in_stack_fffffffffffff6d8);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(in_stack_fffffffffffff720._M_current,in_stack_fffffffffffff718._M_current)
                ;
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                CLI::detail::ltrim((string *)
                                   CONCAT17(in_stack_fffffffffffff717,
                                            CONCAT16(in_stack_fffffffffffff716,
                                                     in_stack_fffffffffffff710)));
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase(in_stack_fffffffffffff6e0,(size_type)in_stack_fffffffffffff6d8,
                      CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                local_b7 = 1;
                local_321 = 0;
                local_322 = 1;
                bVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x18b32f);
                if ((bVar2) ||
                   (pvVar8 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffff6d7,
                                                    in_stack_fffffffffffff6d0)), *pvVar8 != '\\')) {
                  bVar2 = CLI::detail::hasMLString
                                    (in_stack_fffffffffffff6e8._M_current,
                                     (char)((ulong)in_stack_fffffffffffff6e0 >> 0x38));
                  if (bVar2) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                    if (local_2f9 == '\"') {
                      CLI::detail::remove_escaped_characters(in_RDI);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (in_stack_fffffffffffff720._M_current,
                                 in_stack_fffffffffffff718._M_current);
                      ::std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                    }
                    local_b7 = 0;
                  }
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  local_321 = 1;
                }
                do {
                  if ((local_b7 & 1) == 0) break;
                  ::std::__cxx11::string::string(in_stack_fffffffffffff6e0);
                  piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     (local_18,local_398);
                  bVar4 = ::std::ios::operator!
                                    ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                  if ((bVar4 & 1) == 0) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                                in_stack_fffffffffffff6c8);
                    CLI::detail::rtrim((string *)
                                       CONCAT17(in_stack_fffffffffffff717,
                                                CONCAT16(in_stack_fffffffffffff716,
                                                         in_stack_fffffffffffff710)));
                    bVar2 = CLI::detail::hasMLString
                                      (in_stack_fffffffffffff6e8._M_current,
                                       (char)((ulong)in_stack_fffffffffffff6e0 >> 0x38));
                    if (bVar2) {
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                      if ((local_321 & 1) == 0) {
                        if (((local_322 & 1) == 0) ||
                           (bVar2 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x18b6aa), !bVar2)) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          push_back(in_stack_fffffffffffff6e0,
                                    (char)((ulong)in_stack_fffffffffffff6d8 >> 0x38));
                        }
                      }
                      else {
                        CLI::detail::ltrim((string *)
                                           CONCAT17(in_stack_fffffffffffff717,
                                                    CONCAT16(in_stack_fffffffffffff716,
                                                             in_stack_fffffffffffff710)));
                      }
                      local_322 = 0;
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                                 in_stack_fffffffffffff6c8);
                      local_b7 = 0;
                      bVar2 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x18b6fa);
                      if ((!bVar2) &&
                         (pvVar8 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffff6d7,
                                                      in_stack_fffffffffffff6d0)), *pvVar8 == '\n'))
                      {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0))
                        ;
                      }
                      if (local_2f9 == '\"') {
                        CLI::detail::remove_escaped_characters(in_RDI);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                  (in_stack_fffffffffffff720._M_current,
                                   in_stack_fffffffffffff718._M_current);
                        ::std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0))
                        ;
                      }
                    }
                    else {
                      if ((local_321 & 1) == 0) {
                        if (((local_322 & 1) == 0) ||
                           (bVar2 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x18b8f9), !bVar2)) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          push_back(in_stack_fffffffffffff6e0,
                                    (char)((ulong)in_stack_fffffffffffff6d8 >> 0x38));
                        }
                      }
                      else {
                        CLI::detail::trim((string *)0x18b8de);
                      }
                      local_321 = 0;
                      local_322 = 0;
                      bVar2 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x18b932);
                      if ((!bVar2) &&
                         (pvVar8 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffff6d7,
                                                      in_stack_fffffffffffff6d0)), *pvVar8 == '\\'))
                      {
                        local_321 = 1;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0))
                        ;
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                                 in_stack_fffffffffffff6c8);
                    }
                    local_15c = 0;
                  }
                  else {
                    local_15c = 9;
                  }
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                } while (local_15c == 0);
                local_420 = &local_418;
                ::std::__cxx11::string::string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff717,
                                    CONCAT16(in_stack_fffffffffffff716,in_stack_fffffffffffff710)),
                           in_stack_fffffffffffff708);
                local_3f8[0]._M_dataplus._M_p = (pointer)&local_418;
                local_3f8[0]._M_string_length = 1;
                __l._M_len._0_7_ = in_stack_fffffffffffff6f0;
                __l._M_array = in_stack_fffffffffffff6e8._M_current;
                __l._M_len._7_1_ = in_stack_fffffffffffff6f7;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff6e0,__l);
                in_stack_fffffffffffff810 = &local_418;
                in_stack_fffffffffffff818 = local_3f8;
                do {
                  in_stack_fffffffffffff818 = in_stack_fffffffffffff818 + -1;
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                } while (in_stack_fffffffffffff818 != in_stack_fffffffffffff810);
              }
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x18c38c);
            CLI::detail::generate_parents
                      (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                       (char)((ulong)in_stack_fffffffffffff898 >> 0x38));
            in_stack_fffffffffffff720._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6e0);
            CLI::detail::process_quoted_string
                      (in_stack_fffffffffffff718._M_current,in_stack_fffffffffffff717,
                       in_stack_fffffffffffff716);
            local_610 = local_110;
            local_618._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(in_stack_fffffffffffff6c8);
            local_620 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6c8);
            while (bVar2 = __gnu_cxx::
                           operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)CONCAT17(in_stack_fffffffffffff6d7,
                                                  in_stack_fffffffffffff6d0),
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffff6c8), ((bVar2 ^ 0xffU) & 1) != 0) {
              local_628 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_618);
              CLI::detail::process_quoted_string
                        (in_stack_fffffffffffff718._M_current,in_stack_fffffffffffff717,
                         in_stack_fffffffffffff716);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_618);
            }
            sVar12 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_608 + 0x18));
            if (*(byte *)(in_RSI + 0x27) < sVar12) {
              local_15c = 2;
            }
            else {
              bVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x18c610);
              if ((bVar2) || ((local_b5 & 1) != 0)) {
LAB_0018c720:
                bVar2 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::empty
                                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                                   in_stack_fffffffffffff6e0);
                if (bVar2) {
LAB_0018c83f:
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(in_stack_fffffffffffff720._M_current,
                            in_stack_fffffffffffff718._M_current);
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6e0,&in_stack_fffffffffffff6d8->parents);
                }
                else {
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffff6f7,
                                                        in_stack_fffffffffffff6f0),
                                            in_stack_fffffffffffff6e8._M_current);
                  if (!_Var3) goto LAB_0018c83f;
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  in_stack_fffffffffffff6f7 =
                       ::std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)CONCAT17(in_stack_fffffffffffff6f7,
                                                     in_stack_fffffffffffff6f0),
                                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)in_stack_fffffffffffff6e8._M_current);
                  if (!(bool)in_stack_fffffffffffff6f7) goto LAB_0018c83f;
                  pvVar11 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                                       CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)
                                      );
                  in_stack_fffffffffffff6e0 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pvVar11->inputs;
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  local_680 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_fffffffffffff6c8);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ::__normal_iterator<std::__cxx11::string*>
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff6c8);
                  in_stack_fffffffffffff6d8 = (value_type *)local_110;
                  local_688 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_fffffffffffff6c8);
                  local_690 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_fffffffffffff6c8);
                  in_stack_fffffffffffff6e8 =
                       ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                       insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff717,
                                              CONCAT16(in_stack_fffffffffffff716,
                                                       in_stack_fffffffffffff710)),
                                  in_stack_fffffffffffff728,in_stack_fffffffffffff720,
                                  in_stack_fffffffffffff718);
                  local_698 = in_stack_fffffffffffff6e8._M_current;
                }
                local_15c = 0;
              }
              else {
                bVar2 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6e0);
                if (!bVar2) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
                  _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffff6f7,
                                                        in_stack_fffffffffffff6f0),
                                            in_stack_fffffffffffff6e8._M_current);
                  if (((_Var3 ^ 0xffU) & 1) == 0) {
                    if ((-1 < *(short *)(in_RSI + 0x2a)) && (local_c0 != *(short *)(in_RSI + 0x2a)))
                    {
                      local_15c = 2;
                      goto LAB_0018c8b8;
                    }
                    in_stack_fffffffffffff6f8 = local_608 + 0x18;
                    local_668 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)in_stack_fffffffffffff6c8);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ::__normal_iterator<std::__cxx11::string*>
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffff6c8);
                    in_stack_fffffffffffff700 =
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::erase(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6e8._M_current);
                    local_b5 = 1;
                    local_670 = in_stack_fffffffffffff700._M_current;
                    goto LAB_0018c720;
                  }
                }
                local_15c = 2;
              }
            }
LAB_0018c8b8:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6e0);
          }
        }
      }
    }
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff6e0);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // mutliline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        if(!output.empty() && name == output.back().name && parents == output.back().parents) {
            output.back().inputs.insert(output.back().inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}